

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::MILSpec::Operation::ByteSizeLong(Operation *this)

{
  Rep *pRVar1;
  size_t sVar2;
  size_t sVar3;
  string *value;
  void **ppvVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  const_iterator it;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  local_40;
  
  uVar7 = (ulong)(uint)(this->inputs_).map_.elements_.num_elements_;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
  ::InnerMap::
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
  ::iterator_base((iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
                   *)&local_40,(InnerMap *)&this->inputs_);
  while (local_40.node_ != (Node *)0x0) {
    sVar2 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40.node_,(Argument *)&(local_40.node_)->field_0x20);
    uVar7 = uVar7 + sVar2;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
    ::InnerMap::
    iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
    ::operator++((iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
                  *)&local_40);
  }
  lVar6 = (long)(this->outputs_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = uVar7 + lVar6;
  pRVar1 = (this->outputs_).super_RepeatedPtrFieldBase.rep_;
  ppvVar4 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar4 = (void **)0x0;
  }
  for (lVar5 = 0; lVar6 * 8 != lVar5; lVar5 = lVar5 + 8) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::NamedValueType>
                      (*(NamedValueType **)((long)ppvVar4 + lVar5));
    lVar8 = lVar8 + sVar2;
  }
  lVar6 = (long)(this->blocks_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = lVar8 + lVar6;
  pRVar1 = (this->blocks_).super_RepeatedPtrFieldBase.rep_;
  ppvVar4 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar4 = (void **)0x0;
  }
  for (lVar5 = 0; lVar6 * 8 != lVar5; lVar5 = lVar5 + 8) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::Block>(*(Block **)((long)ppvVar4 + lVar5));
    lVar8 = lVar8 + sVar2;
  }
  sVar2 = (ulong)(uint)(this->attributes_).map_.elements_.num_elements_ + lVar8;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::InnerMap::
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  ::iterator_base(&local_40,(InnerMap *)&this->attributes_);
  while (local_40.node_ != (Node *)0x0) {
    sVar3 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40.node_,(Value *)&(local_40.node_)->field_0x20);
    sVar2 = sVar2 + sVar3;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
    ::InnerMap::
    iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
    ::operator++(&local_40);
  }
  value = (string *)((ulong)(this->type_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (value->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sVar2 = sVar2 + sVar3 + 1;
  }
  uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar7 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t Operation::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Operation)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // map<string, .CoreML.Specification.MILSpec.Argument> inputs = 2;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_inputs_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Argument >::const_iterator
      it = this->_internal_inputs().begin();
      it != this->_internal_inputs().end(); ++it) {
    total_size += Operation_InputsEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  // repeated .CoreML.Specification.MILSpec.NamedValueType outputs = 3;
  total_size += 1UL * this->_internal_outputs_size();
  for (const auto& msg : this->outputs_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.MILSpec.Block blocks = 4;
  total_size += 1UL * this->_internal_blocks_size();
  for (const auto& msg : this->blocks_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // map<string, .CoreML.Specification.MILSpec.Value> attributes = 5;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_attributes_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
      it = this->_internal_attributes().begin();
      it != this->_internal_attributes().end(); ++it) {
    total_size += Operation_AttributesEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  // string type = 1;
  if (!this->_internal_type().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_type());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}